

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shaft.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::Shaft::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Shaft *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Shaft:",6);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tCurrent RPM:    ",0x12);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,this->m_i16CurrentRPM);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tOrdered RPM:    ",0x12);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i16OrderedRPM);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tRate Of Change: ",0x12);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i32RPMRateOfChange);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString Shaft::GetAsString() const
{
    KStringStream ss;

    ss << "Shaft:"
       << "\n\tCurrent RPM:    " << m_i16CurrentRPM
       << "\n\tOrdered RPM:    " << m_i16OrderedRPM
       << "\n\tRate Of Change: " << m_i32RPMRateOfChange
       << "\n";

    return ss.str();
}